

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_base.c
# Opt level: O3

int lj_cf_print(lua_State *L)

{
  TValue *pTVar1;
  TValue *pTVar2;
  cTValue *pcVar3;
  TValue *pTVar4;
  cTValue *pcVar5;
  char *__ptr;
  long lVar6;
  long lVar7;
  bool bVar8;
  MSize len;
  size_t size;
  uint local_3c;
  ulong local_38;
  
  pTVar1 = L->base;
  pTVar2 = L->top;
  pcVar5 = lj_tab_getstr((GCtab *)(ulong)(L->env).gcptr32,
                         (GCstr *)(ulong)*(uint *)((ulong)pTVar1[-1].u32.lo + 0x20));
  if ((pcVar5 == (cTValue *)0x0) || ((pcVar5->field_2).it == 0xffffffff)) {
    pTVar4 = L->top;
    L->top = pTVar4 + 1;
    (pTVar4->field_2).field_0 =
         *(anon_union_4_2_de2f9c34_for_anon_struct_8_2_fd66bcdd_for_TValue_2_0 *)
          ((ulong)L->base[-1].u32.lo + 0x20);
    (pTVar4->field_2).it = 0xfffffffb;
    lua_gettable(L,-0x2712);
    pcVar5 = L->top + -1;
  }
  else {
    pcVar3 = L->top;
    L->top = pcVar3 + 1;
    pcVar3->u32 = *(anon_struct_8_2_f9ee98fb_for_u32 *)pcVar5;
  }
  lVar6 = (long)pTVar2 - (long)pTVar1 >> 3;
  if (((pcVar5->field_2).it == 0xfffffff7) && (*(char *)((ulong)(pcVar5->u32).lo + 6) == '\x12')) {
    bVar8 = *(int *)((ulong)(L->glref).ptr32 + 0x224) == 0;
  }
  else {
    bVar8 = false;
  }
  if (0 < lVar6) {
    lVar7 = 0;
    do {
      pcVar5 = (cTValue *)((long)L->base + lVar7);
      if (bVar8) {
        __ptr = lj_strfmt_wstrnum(L,pcVar5,&local_3c);
        if (__ptr == (char *)0x0) goto LAB_0011ee35;
        local_38 = (ulong)local_3c;
      }
      else {
LAB_0011ee35:
        L->top[1] = *pcVar5;
        *L->top = L->top[-1];
        L->top = L->top + 2;
        lua_call(L,1,1);
        __ptr = lua_tolstring(L,-1,&local_38);
        if (__ptr == (char *)0x0) {
          lj_err_caller(L,LJ_ERR_PRTOSTR);
        }
        L->top = L->top + -1;
      }
      if (lVar7 != 0) {
        putchar(9);
      }
      fwrite(__ptr,1,local_38,_stdout);
      lVar7 = lVar7 + 8;
      lVar6 = lVar6 + -1;
    } while (lVar6 != 0);
  }
  putchar(10);
  return 0;
}

Assistant:

LJLIB_CF(print)
{
  ptrdiff_t i, nargs = L->top - L->base;
  cTValue *tv = lj_tab_getstr(tabref(L->env), strV(lj_lib_upvalue(L, 1)));
  int shortcut;
  if (tv && !tvisnil(tv)) {
    copyTV(L, L->top++, tv);
  } else {
    setstrV(L, L->top++, strV(lj_lib_upvalue(L, 1)));
    lua_gettable(L, LUA_GLOBALSINDEX);
    tv = L->top-1;
  }
  shortcut = (tvisfunc(tv) && funcV(tv)->c.ffid == FF_tostring)
	      && !gcrefu(basemt_it(G(L), LJ_TNUMX));
  for (i = 0; i < nargs; i++) {
    cTValue *o = &L->base[i];
    const char *str;
    size_t size;
    MSize len;
    if (shortcut && (str = lj_strfmt_wstrnum(L, o, &len)) != NULL) {
      size = len;
    } else {
      copyTV(L, L->top+1, o);
      copyTV(L, L->top, L->top-1);
      L->top += 2;
      lua_call(L, 1, 1);
      str = lua_tolstring(L, -1, &size);
      if (!str)
	lj_err_caller(L, LJ_ERR_PRTOSTR);
      L->top--;
    }
    if (i)
      putchar('\t');
    fwrite(str, 1, size, stdout);
  }
  putchar('\n');
  return 0;
}